

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O3

void __thiscall BufferedReader::~BufferedReader(BufferedReader *this)

{
  uint in_EAX;
  _Rb_tree_node_base *p_Var1;
  undefined8 uStack_28;
  
  (this->super_AbstractReader)._vptr_AbstractReader = (_func_int **)&PTR__BufferedReader_0023d1e8;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedReader_0023d278;
  this->m_terminated = true;
  uStack_28 = (ulong)in_EAX;
  SafeQueueWithNotification<int>::push
            (&(this->m_readQueue).super_SafeQueueWithNotification<int>,(int *)((long)&uStack_28 + 4)
            );
  if ((this->super_TerminatableThread).m_thread._M_id._M_thread != 0) {
    std::thread::join();
  }
  for (p_Var1 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  ::~_Rb_tree(&(this->m_readers)._M_t);
  std::condition_variable::~condition_variable(&this->m_readCond);
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>._vptr_SafeQueue =
       (_func_int **)&PTR__WaitableSafeQueue_0023d2e8;
  std::condition_variable::~condition_variable(&(this->m_readQueue).m_cond);
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>._vptr_SafeQueue =
       (_func_int **)&PTR__SafeQueue_0023d358;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue)
  ;
  TerminatableThread::~TerminatableThread(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedReader::~BufferedReader()
{
    terminate();
    m_readQueue.push(0);
    join();
    for (const auto& m_reader : m_readers)
    {
        const ReaderData* pData = m_reader.second;
        delete pData;
    }
}